

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O1

bool __thiscall gutil::Parameter::findParameter(Parameter *this,string *p)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  size_type *psVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  
  pbVar1 = (this->list).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar8 = lVar5 != 0;
  if (bVar8) {
    uVar6 = lVar5 >> 5;
    __s2 = (p->_M_dataplus)._M_p;
    sVar2 = p->_M_string_length;
    psVar4 = &pbVar1->_M_string_length;
    sVar7 = 0;
    do {
      __n = *psVar4;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar4 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        this->cparam = sVar7;
        this->pos = sVar7 + 1;
        return bVar8;
      }
      sVar7 = sVar7 + 1;
      bVar8 = sVar7 < uVar6;
      psVar4 = psVar4 + 4;
    } while (uVar6 + (uVar6 == 0) != sVar7);
  }
  return bVar8;
}

Assistant:

bool Parameter::findParameter(const std::string &p)
{
  assert(allparam.find(p) != allparam.end());

  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i] == p)
    {
      cparam=i;
      pos=i+1;

      return true;
    }
  }

  return false;
}